

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

UniformGridMediumProvider *
pbrt::UniformGridMediumProvider::Create
          (ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_struct_8_0_00000001_for___align aVar1;
  size_t *psVar2;
  memory_resource *pmVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  byte bVar20;
  byte bVar21;
  short sVar22;
  float *pfVar23;
  long lVar24;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *pfVar25;
  float *pfVar26;
  char *message;
  int iVar27;
  PiecewiseLinearSpectrum *this;
  RGBSigmoidPolynomial *this_00;
  ulong uVar28;
  pointer pRVar29;
  ushort uVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  float fVar38;
  Float FVar39;
  undefined1 auVar40 [16];
  undefined1 auVar43 [12];
  undefined1 auVar42 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar44 [60];
  Point3f PVar45;
  span<const_float> v;
  span<const_pbrt::RGBUnboundedSpectrum> v_00;
  span<const_float> v_01;
  span<const_float> v_02;
  int ny;
  int nx;
  int nz;
  vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_> rgbSpectrumDensity
  ;
  optional<pbrt::SampledGrid<float>_> densityGrid;
  SampledGrid<float> LeGrid;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> rgbDensity;
  SpectrumHandle Le;
  vector<float,_std::allocator<float>_> LeScale;
  RGBColorSpace *colorSpace;
  vector<float,_std::allocator<float>_> density;
  size_t nDensity;
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> rgbDensityGrid;
  polymorphic_allocator<std::byte> local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_198;
  int local_188;
  int iStack_184;
  int local_180;
  undefined1 local_178 [48];
  bool local_148;
  SampledGrid<pbrt::RGBUnboundedSpectrum> local_140;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> local_110;
  undefined1 local_f8 [16];
  undefined1 local_e8 [12];
  float local_dc;
  undefined1 local_d8 [32];
  vector<float,_std::allocator<float>_> local_b8;
  Point3f local_a0;
  size_t local_90;
  undefined1 local_88 [16];
  SpectrumHandle local_78;
  undefined8 local_70;
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> local_68;
  undefined8 uVar37;
  undefined1 auVar41 [56];
  
  aVar1 = (anon_struct_8_0_00000001_for___align)((long)local_178 + 0x10);
  local_1c0.memoryResource = alloc.memoryResource;
  local_178._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"density","");
  ParameterDictionary::GetFloatArray(&local_b8,parameters,(string *)local_178);
  if ((anon_struct_8_0_00000001_for___align)local_178._0_8_ != aVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_178._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"density","");
  ParameterDictionary::GetRGBArray(&local_110,parameters,(string *)local_178);
  if ((anon_struct_8_0_00000001_for___align)local_178._0_8_ != aVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      message = "No \"density\" values provided for uniform grid medium.";
      goto LAB_0030f7d7;
    }
    if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) goto LAB_0030eefe;
  }
  else {
LAB_0030eefe:
    if (local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      message = "Both \"float\" and \"rgb\" \"density\" values were provided.";
LAB_0030f7d7:
      ErrorExit(loc,message);
    }
  }
  local_178._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"nx","");
  local_1b0 = ParameterDictionary::GetOneInt(parameters,(string *)local_178,1);
  if ((anon_struct_8_0_00000001_for___align)local_178._0_8_ != aVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_178._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"ny","");
  local_1b4 = ParameterDictionary::GetOneInt(parameters,(string *)local_178,1);
  if ((anon_struct_8_0_00000001_for___align)local_178._0_8_ != aVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_178._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"nz","");
  local_1ac = ParameterDictionary::GetOneInt(parameters,(string *)local_178,1);
  if ((anon_struct_8_0_00000001_for___align)local_178._0_8_ != aVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  auVar44 = in_ZMM1._4_60_;
  if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_90 = ((long)local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  }
  else {
    local_90 = (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  }
  iVar27 = local_1ac * local_1b0 * local_1b4;
  if (local_90 != (long)iVar27) {
    local_178._0_4_ = iVar27;
    ErrorExit<unsigned_long&,int>
              (loc,"Uniform grid medium has %d density values; expected nx*ny*nz = %d",&local_90,
               (int *)local_178);
  }
  local_d8._24_8_ = parameters->colorSpace;
  local_148 = false;
  local_68.set = false;
  if ((long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_1a8 = (undefined1  [8])0x0;
    uStack_1a0 = (RGBUnboundedSpectrum *)0x0;
    aStack_198._M_allocated_capacity._0_4_ = 0;
    aStack_198._M_allocated_capacity._4_4_ = 0;
    if (local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar29 = local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                super__Vector_impl_data._M_start;
      uStack_1a0 = (RGBUnboundedSpectrum *)0x0;
      do {
        local_d8._8_4_ = pRVar29->b;
        local_d8._0_8_ = *(undefined8 *)pRVar29;
        RGBUnboundedSpectrum::RGBUnboundedSpectrum
                  ((RGBUnboundedSpectrum *)&local_140,(RGBColorSpace *)local_d8._24_8_,
                   (RGB *)local_d8);
        if (uStack_1a0 ==
            (RGBUnboundedSpectrum *)
            CONCAT44(aStack_198._M_allocated_capacity._4_4_,aStack_198._M_allocated_capacity._0_4_))
        {
          std::vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>::
          _M_realloc_insert<pbrt::RGBUnboundedSpectrum>
                    ((vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>
                      *)local_1a8,uStack_1a0,(RGBUnboundedSpectrum *)&local_140);
        }
        else {
          *(memory_resource **)uStack_1a0 = local_140.values.alloc.memoryResource;
          *(RGBUnboundedSpectrum **)&(uStack_1a0->rsp).c1 = local_140.values.ptr;
          uStack_1a0 = uStack_1a0 + 1;
        }
        auVar44 = in_ZMM1._4_60_;
        pRVar29 = pRVar29 + 1;
      } while (pRVar29 !=
               local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    v_00.n = (long)uStack_1a0 - (long)local_1a8 >> 4;
    v_00.ptr = (RGBUnboundedSpectrum *)local_1a8;
    SampledGrid<pbrt::RGBUnboundedSpectrum>::SampledGrid
              (&local_140,v_00,local_1b0,local_1b4,local_1ac,(Allocator)local_1c0.memoryResource);
    pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator=(&local_68,&local_140);
    pstd::
    vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
    ::~vector(&local_140.values);
    if (local_1a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a8,
                      CONCAT44(aStack_198._M_allocated_capacity._4_4_,
                               aStack_198._M_allocated_capacity._0_4_) - (long)local_1a8);
    }
  }
  else {
    v.n = (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    v.ptr = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)&local_140,v,local_1b0,local_1b4,local_1ac,
               (Allocator)local_1c0.memoryResource);
    pstd::optional<pbrt::SampledGrid<float>_>::operator=
              ((optional<pbrt::SampledGrid<float>_> *)local_178,(SampledGrid<float> *)&local_140);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_140);
  }
  psVar2 = &local_140.values.nAlloc;
  local_140.values.alloc.memoryResource = (memory_resource *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Le","");
  local_70 = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_e8,(string *)parameters,(SpectrumHandle *)&local_140,
             (SpectrumType)&local_70,(Allocator)0x2);
  if (local_140.values.alloc.memoryResource != (memory_resource *)psVar2) {
    operator_delete(local_140.values.alloc.memoryResource,local_140.values.nAlloc + 1);
  }
  if ((memory_resource *)local_e8._0_8_ != (memory_resource *)0x0) {
    sVar22 = SUB82(local_e8._0_8_,6);
    if ((ulong)local_e8._0_8_ >> 0x32 == 0) {
      this = (PiecewiseLinearSpectrum *)(local_e8._0_8_ & 0xffffffffffff);
      if ((ulong)local_e8._0_8_ >> 0x31 == 0) {
        fVar38 = *(float *)&(this->lambdas).alloc.memoryResource;
      }
      else if (sVar22 == 2) {
        pfVar26 = (float *)(this->lambdas).nAlloc;
        pmVar3 = (this->values).alloc.memoryResource;
        if ((memory_resource *)0x1 < pmVar3) {
          lVar24 = (long)pmVar3 * 4 + -4;
          pfVar25 = pfVar26;
          do {
            pfVar25 = pfVar25 + 1;
            pfVar23 = pfVar25;
            if (*pfVar25 <= *pfVar26) {
              pfVar23 = pfVar26;
            }
            pfVar26 = pfVar23;
            lVar24 = lVar24 + -4;
          } while (lVar24 != 0);
        }
        fVar38 = *pfVar26;
      }
      else {
        fVar38 = PiecewiseLinearSpectrum::MaxValue(this);
      }
    }
    else if (SUB84(local_e8._0_8_,4) >> 0x11 < 3) {
      this_00 = (RGBSigmoidPolynomial *)(local_e8._0_8_ & 0xffffffffffff);
      if (sVar22 == 5) {
        local_f8._0_4_ = this_00->c0;
        FVar39 = RGBSigmoidPolynomial::MaxValue((RGBSigmoidPolynomial *)&this_00->c1);
        fVar38 = FVar39 * (float)local_f8._0_4_;
      }
      else {
        fVar38 = RGBSigmoidPolynomial::MaxValue(this_00);
      }
    }
    else if (sVar22 == 6) {
      fVar38 = RGBIlluminantSpectrum::MaxValue
                         ((RGBIlluminantSpectrum *)(local_e8._0_8_ & 0xffffffffffff));
    }
    else {
      fVar38 = 1.0;
    }
    auVar44 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
    if ((fVar38 != 0.0) || (NAN(fVar38))) {
      local_78.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                 )local_e8._0_8_;
      FVar39 = SpectrumToPhotometric(&local_78);
      auVar44 = (undefined1  [60])0x0;
      local_f8 = ZEXT416((uint)(1.0 / FVar39));
      goto LAB_0030f38b;
    }
  }
  iVar27 = (*(local_1c0.memoryResource)->_vptr_memory_resource[2])(local_1c0.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar27) = 0;
  local_e8._0_8_ = CONCAT44(extraout_var,iVar27) | 0x1000000000000;
  local_f8 = SUB6416(ZEXT464(0x3f800000),0);
LAB_0030f38b:
  local_140.values.alloc.memoryResource = local_1c0.memoryResource;
  uVar37 = 0;
  local_140.values.ptr = (RGBUnboundedSpectrum *)0x0;
  local_140.values.nAlloc = 0;
  local_140.values.nStored = 0;
  local_1a8 = (undefined1  [8])&aStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Lescale","");
  ParameterDictionary::GetFloatArray
            ((vector<float,_std::allocator<float>_> *)local_d8,parameters,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])&aStack_198) {
    operator_delete((void *)local_1a8,
                    CONCAT44(aStack_198._M_allocated_capacity._4_4_,
                             aStack_198._M_allocated_capacity._0_4_) + 1);
  }
  auVar43 = auVar44._0_12_;
  if ((ParsedParameter *)local_d8._0_8_ ==
      (ParsedParameter *)CONCAT44(local_d8._12_4_,local_d8._8_4_)) {
    local_a0.super_Tuple3<pbrt::Point3,_float>.x = (float)local_f8._0_4_;
    v_02.n = 1;
    v_02.ptr = (float *)&local_a0;
    uVar37 = local_f8._8_8_;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)local_1a8,v_02,1,1,1,(Allocator)local_1c0.memoryResource);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_140,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1a8);
  }
  else {
    v_01.n = (pointer)((long)CONCAT44(local_d8._12_4_,local_d8._8_4_) - local_d8._0_8_ >> 2);
    iVar27 = local_1b4 * local_1b0 * local_1ac;
    if (v_01.n != (pointer)(long)iVar27) {
      local_a0.super_Tuple3<pbrt::Point3,_float>.x = (float)iVar27;
      local_1a8 = (undefined1  [8])v_01.n;
      ErrorExit<int&,int&,int&,int,unsigned_long>
                ("Expected %d x %d %d = %d values for \"Lescale\" but were given %d.",&local_1b0,
                 &local_1b4,&local_1ac,(int *)&local_a0,(unsigned_long *)local_1a8);
    }
    if (0 < iVar27) {
      auVar31 = vpbroadcastq_avx512f();
      uVar37 = auVar31._8_8_;
      auVar32 = vbroadcastss_avx512f(ZEXT416((uint)local_f8._0_4_));
      auVar43 = auVar32._4_12_;
      uVar28 = 0;
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar35 = vpbroadcastq_avx512f();
        auVar36 = vporq_avx512f(auVar35,auVar33);
        auVar35 = vporq_avx512f(auVar35,auVar34);
        uVar19 = vpcmpuq_avx512f(auVar35,auVar31,2);
        bVar20 = (byte)uVar19;
        uVar19 = vpcmpuq_avx512f(auVar36,auVar31,2);
        bVar21 = (byte)uVar19;
        uVar30 = CONCAT11(bVar21,bVar20);
        pfVar26 = (float *)((long)&(((string *)local_d8._0_8_)->_M_dataplus)._M_p + uVar28 * 4);
        auVar35._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * (int)pfVar26[1];
        auVar35._0_4_ = (uint)(bVar20 & 1) * (int)*pfVar26;
        auVar35._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * (int)pfVar26[2];
        auVar35._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * (int)pfVar26[3];
        auVar35._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * (int)pfVar26[4];
        auVar35._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * (int)pfVar26[5];
        auVar35._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * (int)pfVar26[6];
        auVar35._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * (int)pfVar26[7];
        auVar35._32_4_ = (uint)(bVar21 & 1) * (int)pfVar26[8];
        auVar35._36_4_ = (uint)(bVar21 >> 1 & 1) * (int)pfVar26[9];
        auVar35._40_4_ = (uint)(bVar21 >> 2 & 1) * (int)pfVar26[10];
        auVar35._44_4_ = (uint)(bVar21 >> 3 & 1) * (int)pfVar26[0xb];
        auVar35._48_4_ = (uint)(bVar21 >> 4 & 1) * (int)pfVar26[0xc];
        auVar35._52_4_ = (uint)(bVar21 >> 5 & 1) * (int)pfVar26[0xd];
        auVar35._56_4_ = (uint)(bVar21 >> 6 & 1) * (int)pfVar26[0xe];
        auVar35._60_4_ = (uint)(bVar21 >> 7) * (int)pfVar26[0xf];
        auVar35 = vmulps_avx512f(auVar32,auVar35);
        pfVar26 = (float *)((long)&(((string *)local_d8._0_8_)->_M_dataplus)._M_p + uVar28 * 4);
        bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
        bVar10 = (bool)((byte)(uVar30 >> 7) & 1);
        bVar11 = (bool)(bVar21 >> 1 & 1);
        bVar12 = (bool)(bVar21 >> 2 & 1);
        bVar13 = (bool)(bVar21 >> 3 & 1);
        bVar14 = (bool)(bVar21 >> 4 & 1);
        bVar15 = (bool)(bVar21 >> 5 & 1);
        bVar16 = (bool)(bVar21 >> 6 & 1);
        *pfVar26 = (float)((uint)(bVar20 & 1) * auVar35._0_4_ |
                          (uint)!(bool)(bVar20 & 1) * (int)*pfVar26);
        pfVar26[1] = (float)((uint)bVar4 * auVar35._4_4_ | (uint)!bVar4 * (int)pfVar26[1]);
        pfVar26[2] = (float)((uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * (int)pfVar26[2]);
        pfVar26[3] = (float)((uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * (int)pfVar26[3]);
        pfVar26[4] = (float)((uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * (int)pfVar26[4]);
        pfVar26[5] = (float)((uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * (int)pfVar26[5]);
        pfVar26[6] = (float)((uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * (int)pfVar26[6]);
        pfVar26[7] = (float)((uint)bVar10 * auVar35._28_4_ | (uint)!bVar10 * (int)pfVar26[7]);
        pfVar26[8] = (float)((uint)(bVar21 & 1) * auVar35._32_4_ |
                            (uint)!(bool)(bVar21 & 1) * (int)pfVar26[8]);
        pfVar26[9] = (float)((uint)bVar11 * auVar35._36_4_ | (uint)!bVar11 * (int)pfVar26[9]);
        pfVar26[10] = (float)((uint)bVar12 * auVar35._40_4_ | (uint)!bVar12 * (int)pfVar26[10]);
        pfVar26[0xb] = (float)((uint)bVar13 * auVar35._44_4_ | (uint)!bVar13 * (int)pfVar26[0xb]);
        pfVar26[0xc] = (float)((uint)bVar14 * auVar35._48_4_ | (uint)!bVar14 * (int)pfVar26[0xc]);
        pfVar26[0xd] = (float)((uint)bVar15 * auVar35._52_4_ | (uint)!bVar15 * (int)pfVar26[0xd]);
        pfVar26[0xe] = (float)((uint)bVar16 * auVar35._56_4_ | (uint)!bVar16 * (int)pfVar26[0xe]);
        pfVar26[0xf] = (float)((uint)(bVar21 >> 7) * auVar35._60_4_ |
                              (uint)!(bool)(bVar21 >> 7) * (int)pfVar26[0xf]);
        uVar28 = uVar28 + 0x10;
      } while ((iVar27 + 0xfU & 0xfffffff0) != uVar28);
    }
    auVar44 = ZEXT1260(auVar43);
    v_01.ptr = (float *)local_d8._0_8_;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)local_1a8,v_01,local_1b0,local_1b4,local_1ac,
               (Allocator)local_1c0.memoryResource);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_140,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1a8);
  }
  local_140.nz = local_180;
  local_140.nx = local_188;
  local_140.ny = iStack_184;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1a8);
  local_1a8 = (undefined1  [8])&aStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"p0","");
  local_a0.super_Tuple3<pbrt::Point3,_float>._0_8_ = (ParsedParameter *)0x0;
  local_a0.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  PVar45 = ParameterDictionary::GetOnePoint3f(parameters,(string *)local_1a8,&local_a0);
  local_dc = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
  local_f8._8_8_ = uVar37;
  local_f8._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
  if (local_1a8 != (undefined1  [8])&aStack_198) {
    operator_delete((void *)local_1a8,
                    CONCAT44(aStack_198._M_allocated_capacity._4_4_,
                             aStack_198._M_allocated_capacity._0_4_) + 1);
  }
  local_1a8 = (undefined1  [8])&aStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"p1","");
  auVar40._8_4_ = 0x3f800000;
  auVar40._0_8_ = 0x3f8000003f800000;
  auVar40._12_4_ = 0x3f800000;
  auVar41 = ZEXT856(auVar40._8_8_);
  local_a0.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar40);
  local_a0.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  PVar45 = ParameterDictionary::GetOnePoint3f(parameters,(string *)local_1a8,&local_a0);
  auVar32._0_4_ = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
  auVar32._4_60_ = auVar44;
  auVar42 = auVar32._0_16_;
  auVar31._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = auVar41;
  auVar40 = auVar31._0_16_;
  if (local_1a8 != (undefined1  [8])&aStack_198) {
    local_e8._8_4_ = auVar32._0_4_;
    local_88 = auVar31._0_16_;
    operator_delete((void *)local_1a8,
                    CONCAT44(aStack_198._M_allocated_capacity._4_4_,
                             aStack_198._M_allocated_capacity._0_4_) + 1);
    auVar42 = ZEXT416((uint)local_e8._8_4_);
    auVar40 = local_88;
  }
  auVar17 = vminps_avx(auVar40,local_f8);
  auVar18 = vminss_avx(auVar42,ZEXT416((uint)local_dc));
  local_1a8 = (undefined1  [8])vmovlps_avx(auVar17);
  uStack_1a0._0_4_ = auVar18._0_4_;
  auVar40 = vmaxps_avx(auVar40,local_f8);
  auVar42 = vmaxss_avx(auVar42,ZEXT416((uint)local_dc));
  uVar37 = vmovlps_avx(auVar40);
  uStack_1a0._4_4_ = (float)uVar37;
  aStack_198._M_allocated_capacity._0_4_ = (undefined4)((ulong)uVar37 >> 0x20);
  aStack_198._M_allocated_capacity._4_4_ = auVar42._0_4_;
  iVar27 = (*(local_1c0.memoryResource)->_vptr_memory_resource[2])(local_1c0.memoryResource,0xe8,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&local_1c0,(UniformGridMediumProvider *)CONCAT44(extraout_var_00,iVar27),
             (Bounds3<float> *)local_1a8,(optional<pbrt::SampledGrid<float>_> *)local_178,&local_68,
             (RGBColorSpace **)(local_d8 + 0x18),(SpectrumHandle *)local_e8,
             (SampledGrid<float> *)&local_140,&local_1c0);
  if ((ParsedParameter *)local_d8._0_8_ != (ParsedParameter *)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_140);
  if (local_68.set == true) {
    pstd::
    vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
    ::~vector((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
               *)&local_68);
    local_68.set = false;
  }
  if (local_148 == true) {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_178);
    local_148 = false;
  }
  if (local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((ParsedParameter *)
      local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (ParsedParameter *)0x0) {
    operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (UniformGridMediumProvider *)CONCAT44(extraout_var_00,iVar27);
}

Assistant:

UniformGridMediumProvider *UniformGridMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::vector<Float> density = parameters.GetFloatArray("density");
    std::vector<RGB> rgbDensity = parameters.GetRGBArray("density");
    if (density.empty() && rgbDensity.empty())
        ErrorExit(loc, "No \"density\" values provided for uniform grid medium.");
    if (!density.empty() && !rgbDensity.empty())
        ErrorExit(loc, "Both \"float\" and \"rgb\" \"density\" values were provided.");

    int nx = parameters.GetOneInt("nx", 1);
    int ny = parameters.GetOneInt("ny", 1);
    int nz = parameters.GetOneInt("nz", 1);
    size_t nDensity = !density.empty() ? density.size() : rgbDensity.size();
    if (nDensity != nx * ny * nz)
        ErrorExit(loc,
                  "Uniform grid medium has %d density values; expected nx*ny*nz = %d",
                  nDensity, nx * ny * nz);

    const RGBColorSpace *colorSpace = parameters.ColorSpace();

    pstd::optional<SampledGrid<Float>> densityGrid;
    pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbDensityGrid;
    if (density.size())
        densityGrid = SampledGrid<Float>(density, nx, ny, nz, alloc);
    else {
        std::vector<RGBUnboundedSpectrum> rgbSpectrumDensity;
        for (RGB rgb : rgbDensity)
            rgbSpectrumDensity.push_back(RGBUnboundedSpectrum(*colorSpace, rgb));
        rgbDensityGrid =
            SampledGrid<RGBUnboundedSpectrum>(rgbSpectrumDensity, nx, ny, nz, alloc);
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeNorm = 1;
    if (Le == nullptr || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeNorm = 1 / SpectrumToPhotometric(Le);

    SampledGrid<Float> LeGrid(alloc);
    std::vector<Float> LeScale = parameters.GetFloatArray("Lescale");
    if (LeScale.empty())
        LeGrid = SampledGrid<Float>({LeNorm}, 1, 1, 1, alloc);
    else {
        if (LeScale.size() != nx * ny * nz)
            ErrorExit("Expected %d x %d %d = %d values for \"Lescale\" but were "
                      "given %d.",
                      nx, ny, nz, nx * ny * nz, LeScale.size());
        for (int i = 0; i < nx * ny * nz; ++i)
            LeScale[i] *= LeNorm;
        LeGrid = SampledGrid<Float>(LeScale, nx, ny, nz, alloc);
    }

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    return alloc.new_object<UniformGridMediumProvider>(
        Bounds3f(p0, p1), std::move(densityGrid), std::move(rgbDensityGrid), colorSpace,
        Le, std::move(LeGrid), alloc);
}